

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

bool __thiscall
TMapIterator<FName,_FMenuDescriptor_*,_TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>_>
::NextPair(TMapIterator<FName,_FMenuDescriptor_*,_TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>_>
           *this,Pair **pair)

{
  uint uVar1;
  Node *pNVar2;
  uint uVar3;
  ulong uVar4;
  IPair *pIVar5;
  
  uVar4 = (ulong)this->Position;
  uVar1 = this->Map->Size;
  if (this->Position < uVar1) {
    pNVar2 = this->Map->Nodes + uVar4;
    do {
      pIVar5 = &pNVar2->Pair;
      if (*(long *)((long)(pIVar5 + -1) + 8) != 1) {
        *pair = (Pair *)pIVar5;
        this->Position = (int)uVar4 + 1;
        return true;
      }
      uVar3 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar3;
      this->Position = uVar3;
      pNVar2 = (Node *)(pIVar5 + 1);
    } while (uVar3 < uVar1);
  }
  return false;
}

Assistant:

bool NextPair(typename MapType::Pair *&pair)
	{
		if (Position >= Map.Size)
		{
			return false;
		}
		do
		{
			if (!Map.Nodes[Position].IsNil())
			{
				pair = reinterpret_cast<typename MapType::Pair *>(&Map.Nodes[Position].Pair);
				Position += 1;
				return true;
			}
		} while (++Position < Map.Size);
		return false;
	}